

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::ClearOutputData(ImFont *this)

{
  ImFontGlyph *ptr;
  float *ptr_00;
  ImWchar *ptr_01;
  
  this->FallbackAdvanceX = 0.0;
  this->FontSize = 0.0;
  ptr = (this->Glyphs).Data;
  if (ptr != (ImFontGlyph *)0x0) {
    (this->Glyphs).Size = L'\0';
    (this->Glyphs).Capacity = L'\0';
    ImGui::MemFree(ptr);
    (this->Glyphs).Data = (ImFontGlyph *)0x0;
  }
  ptr_00 = (this->IndexAdvanceX).Data;
  if (ptr_00 != (float *)0x0) {
    (this->IndexAdvanceX).Size = L'\0';
    (this->IndexAdvanceX).Capacity = L'\0';
    ImGui::MemFree(ptr_00);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  ptr_01 = (this->IndexLookup).Data;
  if (ptr_01 != (ImWchar *)0x0) {
    (this->IndexLookup).Size = L'\0';
    (this->IndexLookup).Capacity = L'\0';
    ImGui::MemFree(ptr_01);
    (this->IndexLookup).Data = (ImWchar *)0x0;
  }
  this->FallbackGlyph = (ImFontGlyph *)0x0;
  this->ContainerAtlas = (ImFontAtlas_conflict *)0x0;
  this->DirtyLookupTables = true;
  this->Ascent = 0.0;
  this->Descent = 0.0;
  this->MetricsTotalSurface = L'\0';
  return;
}

Assistant:

void    ImFont::ClearOutputData()
{
    FontSize = 0.0f;
    FallbackAdvanceX = 0.0f;
    Glyphs.clear();
    IndexAdvanceX.clear();
    IndexLookup.clear();
    FallbackGlyph = NULL;
    ContainerAtlas = NULL;
    DirtyLookupTables = true;
    Ascent = Descent = 0.0f;
    MetricsTotalSurface = 0;
}